

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

void __thiscall n_e_s::core::Ppu::increase_scroll_counters(Ppu *this)

{
  bool bVar1;
  unsigned_short uVar2;
  uint16_t *puVar3;
  bool local_2a;
  bool local_29;
  PpuVram local_1a;
  ushort local_18;
  byte local_15;
  PpuVram local_14;
  ushort local_12;
  unsigned_short addr_1;
  bool should_increase_coarse_x;
  unsigned_short addr;
  Ppu *this_local;
  
  _addr_1 = this;
  bVar1 = PpuMask::is_rendering_enabled(&this->registers_->mask);
  if (bVar1) {
    puVar3 = scanline(this);
    if (((*puVar3 == 0x105) && (puVar3 = cycle(this), 0x117 < *puVar3)) &&
       (puVar3 = cycle(this), *puVar3 < 0x131)) {
      uVar2 = Register<unsigned_short>::value
                        (&(this->registers_->vram_addr).super_Register<unsigned_short>);
      local_12 = uVar2 & 0x841f;
      uVar2 = Register<unsigned_short>::value
                        (&(this->registers_->temp_vram_addr).super_Register<unsigned_short>);
      local_12 = local_12 | uVar2 & 0x7be0;
      PpuVram::Register(&local_14,local_12);
      (this->registers_->vram_addr).super_Register<unsigned_short>.value_ =
           (unsigned_short)local_14.super_Register<unsigned_short>.value_;
    }
    puVar3 = cycle(this);
    local_29 = true;
    if (*puVar3 != 0) {
      puVar3 = cycle(this);
      local_2a = false;
      if (0xff < *puVar3) {
        puVar3 = cycle(this);
        local_2a = *puVar3 < 0x141;
      }
      local_29 = local_2a;
    }
    local_15 = (local_29 ^ 0xffU) & 1;
    if ((local_15 != 0) && (puVar3 = cycle(this), (uint)*puVar3 % 8 == 0)) {
      PpuVram::increase_coarse_x(&this->registers_->vram_addr);
    }
    puVar3 = cycle(this);
    if (*puVar3 == 0x100) {
      PpuVram::increase_y(&this->registers_->vram_addr);
    }
    else {
      puVar3 = cycle(this);
      if (*puVar3 == 0x101) {
        uVar2 = Register<unsigned_short>::value
                          (&(this->registers_->vram_addr).super_Register<unsigned_short>);
        local_18 = uVar2 & 0xfbe0;
        uVar2 = Register<unsigned_short>::value
                          (&(this->registers_->temp_vram_addr).super_Register<unsigned_short>);
        local_18 = local_18 | uVar2 & 0x41f;
        PpuVram::Register(&local_1a,local_18);
        (this->registers_->vram_addr).super_Register<unsigned_short>.value_ =
             (unsigned_short)local_1a.super_Register<unsigned_short>.value_;
      }
    }
  }
  return;
}

Assistant:

void Ppu::increase_scroll_counters() {
    if (!registers_->mask.is_rendering_enabled()) {
        return;
    }

    // During pixels 280 through 304 of this scanline, the vertical scroll bits
    // are reloaded if rendering is enabled. vert(v) == vert(t)
    if (scanline() == kPreRenderScanline) {
        if (cycle() >= 280 && cycle() <= 304) {
            auto addr = registers_->vram_addr.value();
            addr &= static_cast<uint16_t>(~0x7BE0u);
            addr |= (registers_->temp_vram_addr.value() & 0x7BE0u);
            registers_->vram_addr = PpuVram(addr);
        }
    }

    const bool should_increase_coarse_x =
            !(cycle() == 0 || (cycle() >= 256 && cycle() <= 320));
    if (should_increase_coarse_x && (cycle() % 8) == 0) {
        registers_->vram_addr.increase_coarse_x();
    }

    if (cycle() == 256) {
        registers_->vram_addr.increase_y();
    } else if (cycle() == 257) {
        // Copies all bits related to horizontal position from
        // temporal to current vram_address
        // From http://wiki.nesdev.com/w/index.php/PPU_scrolling
        // If rendering is enabled, the PPU copies all bits related to
        // horizontal position from t to v:
        auto addr = registers_->vram_addr.value();
        addr &= ~0x41Fu;
        addr |= registers_->temp_vram_addr.value() & 0x41Fu;
        registers_->vram_addr = PpuVram(addr);
    }
}